

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_typeinfo(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  int *piVar4;
  GCtab *t_00;
  GCstr *pGVar5;
  TValue *pTVar6;
  GCstr *s;
  GCtab *t;
  CType *ct;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  
  plVar1 = *(long **)((L->glref).ptr64 + 0x180);
  plVar1[2] = (long)L;
  uVar3 = ffi_checkint(L,1);
  if ((uVar3 == 0) || (*(uint *)(plVar1 + 1) <= uVar3)) {
    L_local._4_4_ = 0;
  }
  else {
    piVar4 = (int *)(*plVar1 + (ulong)uVar3 * 0x18);
    lua_createtable(L,0,4);
    t_00 = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    pGVar5 = lj_str_new(L,"info",4);
    pTVar6 = lj_tab_setstr(L,t_00,pGVar5);
    pTVar6->n = (double)*piVar4;
    if (piVar4[1] != -1) {
      pGVar5 = lj_str_new(L,"size",4);
      pTVar6 = lj_tab_setstr(L,t_00,pGVar5);
      pTVar6->n = (double)piVar4[1];
    }
    if ((short)piVar4[2] != 0) {
      pGVar5 = lj_str_new(L,"sib",3);
      pTVar6 = lj_tab_setstr(L,t_00,pGVar5);
      pTVar6->n = (double)*(ushort *)(piVar4 + 2);
    }
    if (*(long *)(piVar4 + 4) != 0) {
      uVar2 = *(ulong *)(piVar4 + 4);
      if ((*(byte *)(uVar2 + 8) & (*(byte *)((L->glref).ptr64 + 0x20) ^ 3) & 3) != 0) {
        *(byte *)(uVar2 + 8) = *(byte *)(uVar2 + 8) ^ 3;
      }
      pGVar5 = lj_str_new(L,"name",4);
      pTVar6 = lj_tab_setstr(L,t_00,pGVar5);
      pTVar6->u64 = uVar2 | 0xfffd800000000000;
    }
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(ffi_typeinfo)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = (CTypeID)ffi_checkint(L, 1);
  if (id > 0 && id < cts->top) {
    CType *ct = ctype_get(cts, id);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "info")), (int32_t)ct->info);
    if (ct->size != CTSIZE_INVALID)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "size")), (int32_t)ct->size);
    if (ct->sib)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "sib")), (int32_t)ct->sib);
    if (gcref(ct->name)) {
      GCstr *s = gco2str(gcref(ct->name));
      if (isdead(G(L), obj2gco(s))) flipwhite(obj2gco(s));
      setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "name")), s);
    }
    lj_gc_check(L);
    return 1;
  }
  return 0;
}